

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

String * __thiscall
kj::_::anon_unknown_2::makeDescriptionImpl
          (String *__return_storage_ptr__,anon_unknown_2 *this,DescriptionStyle style,char *code,
          int errorNumber,char *sysErrorString,char *macroArgs,ArrayPtr<kj::String> argValues)

{
  char cVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ExceptionCallback *pEVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  undefined4 in_register_00000014;
  String *pSVar10;
  String *pSVar11;
  long *plVar12;
  void *pvVar13;
  undefined4 in_register_00000084;
  bool bVar14;
  uint uVar15;
  long lVar17;
  size_t sVar18;
  char *pcVar19;
  uint uVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  Array<kj::ArrayPtr<const_char>_> argNames_heap;
  ArrayPtr<const_char> argNames_stack [8];
  char buffer [256];
  undefined4 in_stack_fffffffffffffdec;
  char *local_210;
  long local_208;
  char *local_1f8;
  String *pSStack_1f0;
  undefined8 *local_1e8;
  long local_1e0;
  char *local_1d8;
  long local_1d0;
  String *local_1c8;
  String *local_1c0;
  char local_1b8 [128];
  String local_138 [11];
  ulong uVar16;
  
  local_1d0 = CONCAT44(in_register_00000084,errorNumber);
  pcVar19 = (char *)CONCAT44(in_register_00000014,style);
  uVar16 = (ulong)this & 0xffffffff;
  uVar15 = (uint)this;
  local_1b8[0x70] = '\0';
  local_1b8[0x71] = '\0';
  local_1b8[0x72] = '\0';
  local_1b8[0x73] = '\0';
  local_1b8[0x74] = '\0';
  local_1b8[0x75] = '\0';
  local_1b8[0x76] = '\0';
  local_1b8[0x77] = '\0';
  local_1b8[0x78] = '\0';
  local_1b8[0x79] = '\0';
  local_1b8[0x7a] = '\0';
  local_1b8[0x7b] = '\0';
  local_1b8[0x7c] = '\0';
  local_1b8[0x7d] = '\0';
  local_1b8[0x7e] = '\0';
  local_1b8[0x7f] = '\0';
  local_1b8[0x60] = '\0';
  local_1b8[0x61] = '\0';
  local_1b8[0x62] = '\0';
  local_1b8[99] = '\0';
  local_1b8[100] = '\0';
  local_1b8[0x65] = '\0';
  local_1b8[0x66] = '\0';
  local_1b8[0x67] = '\0';
  local_1b8[0x68] = '\0';
  local_1b8[0x69] = '\0';
  local_1b8[0x6a] = '\0';
  local_1b8[0x6b] = '\0';
  local_1b8[0x6c] = '\0';
  local_1b8[0x6d] = '\0';
  local_1b8[0x6e] = '\0';
  local_1b8[0x6f] = '\0';
  local_1b8[0x50] = '\0';
  local_1b8[0x51] = '\0';
  local_1b8[0x52] = '\0';
  local_1b8[0x53] = '\0';
  local_1b8[0x54] = '\0';
  local_1b8[0x55] = '\0';
  local_1b8[0x56] = '\0';
  local_1b8[0x57] = '\0';
  local_1b8[0x58] = '\0';
  local_1b8[0x59] = '\0';
  local_1b8[0x5a] = '\0';
  local_1b8[0x5b] = '\0';
  local_1b8[0x5c] = '\0';
  local_1b8[0x5d] = '\0';
  local_1b8[0x5e] = '\0';
  local_1b8[0x5f] = '\0';
  local_1b8[0x40] = '\0';
  local_1b8[0x41] = '\0';
  local_1b8[0x42] = '\0';
  local_1b8[0x43] = '\0';
  local_1b8[0x44] = '\0';
  local_1b8[0x45] = '\0';
  local_1b8[0x46] = '\0';
  local_1b8[0x47] = '\0';
  local_1b8[0x48] = '\0';
  local_1b8[0x49] = '\0';
  local_1b8[0x4a] = '\0';
  local_1b8[0x4b] = '\0';
  local_1b8[0x4c] = '\0';
  local_1b8[0x4d] = '\0';
  local_1b8[0x4e] = '\0';
  local_1b8[0x4f] = '\0';
  local_1b8[0x30] = '\0';
  local_1b8[0x31] = '\0';
  local_1b8[0x32] = '\0';
  local_1b8[0x33] = '\0';
  local_1b8[0x34] = '\0';
  local_1b8[0x35] = '\0';
  local_1b8[0x36] = '\0';
  local_1b8[0x37] = '\0';
  local_1b8[0x38] = '\0';
  local_1b8[0x39] = '\0';
  local_1b8[0x3a] = '\0';
  local_1b8[0x3b] = '\0';
  local_1b8[0x3c] = '\0';
  local_1b8[0x3d] = '\0';
  local_1b8[0x3e] = '\0';
  local_1b8[0x3f] = '\0';
  local_1b8[0x20] = '\0';
  local_1b8[0x21] = '\0';
  local_1b8[0x22] = '\0';
  local_1b8[0x23] = '\0';
  local_1b8[0x24] = '\0';
  local_1b8[0x25] = '\0';
  local_1b8[0x26] = '\0';
  local_1b8[0x27] = '\0';
  local_1b8[0x28] = '\0';
  local_1b8[0x29] = '\0';
  local_1b8[0x2a] = '\0';
  local_1b8[0x2b] = '\0';
  local_1b8[0x2c] = '\0';
  local_1b8[0x2d] = '\0';
  local_1b8[0x2e] = '\0';
  local_1b8[0x2f] = '\0';
  local_1b8[0x10] = '\0';
  local_1b8[0x11] = '\0';
  local_1b8[0x12] = '\0';
  local_1b8[0x13] = '\0';
  local_1b8[0x14] = '\0';
  local_1b8[0x15] = '\0';
  local_1b8[0x16] = '\0';
  local_1b8[0x17] = '\0';
  local_1b8[0x18] = '\0';
  local_1b8[0x19] = '\0';
  local_1b8[0x1a] = '\0';
  local_1b8[0x1b] = '\0';
  local_1b8[0x1c] = '\0';
  local_1b8[0x1d] = '\0';
  local_1b8[0x1e] = '\0';
  local_1b8[0x1f] = '\0';
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\0';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\0';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\0';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  if ((String *)&DAT_00000008 < argValues.ptr) {
    pcVar5 = (char *)HeapArrayDisposer::allocateImpl
                               (0x10,(size_t)argValues.ptr,(size_t)argValues.ptr,
                                HeapArrayDisposer::Allocate_<kj::ArrayPtr<const_char>_>::construct,
                                ArrayDisposer::Dispose_<kj::ArrayPtr<const_char>_>::destruct);
    pSStack_1f0 = argValues.ptr;
    local_1e8 = &HeapArrayDisposer::instance;
    local_1f8 = pcVar5;
  }
  else {
    local_1f8 = (char *)0x0;
    pSStack_1f0 = (String *)0x0;
    local_1e8 = (undefined8 *)0x0;
    pcVar5 = local_1b8;
  }
  if (argValues.ptr != (String *)0x0) {
    pcVar21 = (char *)(local_1d0 + -1);
    do {
      pcVar23 = pcVar21 + 1;
      pcVar21 = pcVar21 + 1;
      iVar4 = isspace((int)*pcVar23);
    } while (iVar4 != 0);
    iVar4 = 0;
    bVar14 = false;
    pSVar10 = (String *)0x0;
    pcVar23 = pcVar21;
    uVar20 = uVar15;
    do {
      pcVar22 = pcVar23 + 1;
      cVar1 = *pcVar23;
      if (cVar1 == '\0') {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (bVar14) {
          if (cVar1 == '\"') {
            bVar14 = false;
          }
          else if ((cVar1 == '\\') && (*pcVar22 != '\0')) {
            pcVar22 = pcVar23 + 2;
            bVar3 = true;
          }
        }
        else if (cVar1 == '\"') {
          bVar14 = true;
          bVar3 = true;
        }
        else if (cVar1 == ')') {
          iVar4 = iVar4 + -1;
        }
        else if (cVar1 == '(') {
          iVar4 = iVar4 + 1;
        }
        else if (cVar1 == ',' && iVar4 == 0) {
          if (pSVar10 < argValues.ptr) {
            *(char **)(pcVar5 + (long)pSVar10 * 0x10) = pcVar21;
            *(long *)(pcVar5 + ((long)pSVar10 * 2 + 1) * 8) = (long)pcVar23 - (long)pcVar21;
            pSVar10 = (String *)((long)&(pSVar10->content).ptr + 1);
          }
          do {
            cVar1 = pcVar23[1];
            pcVar21 = pcVar23 + 1;
            iVar4 = isspace((int)cVar1);
            pcVar23 = pcVar21;
          } while (iVar4 != 0);
          iVar4 = 0;
          uVar16 = (ulong)uVar20;
          pcVar22 = pcVar21;
          bVar3 = cVar1 != '\0';
        }
      }
      uVar15 = (uint)uVar16;
      pcVar23 = pcVar22;
    } while (bVar3);
    pSVar11 = pSVar10;
    if (pSVar10 < argValues.ptr) {
      pSVar11 = (String *)((long)&(pSVar10->content).ptr + 1);
      *(char **)(pcVar5 + (long)pSVar10 * 0x10) = pcVar21;
      *(char **)(pcVar5 + ((long)pSVar10 * 2 + 1) * 8) = pcVar22 + ~(ulong)pcVar21;
    }
    if (pSVar11 != argValues.ptr) {
      pEVar6 = getExceptionCallback();
      local_1c0 = argValues.ptr;
      str<char_const(&)[41],unsigned_long,char_const(&)[9],char_const*&,char>
                (local_138,(kj *)"Failed to parse logging macro args into ",
                 (char (*) [41])&local_1c0,(unsigned_long *)" names: ",(char (*) [9])&local_1d0,
                 (char **)&stack0xfffffffffffffdef,
                 (char *)CONCAT44(CONCAT13(10,(int3)in_stack_fffffffffffffdec),uVar20));
      (*pEVar6->_vptr_ExceptionCallback[4])
                (pEVar6,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/debug.c++"
                 ,0xdd,0,local_138);
      sVar18 = local_138[0].content.size_;
      pcVar21 = local_138[0].content.ptr;
      if (local_138[0].content.ptr != (char *)0x0) {
        local_138[0].content.ptr = (char *)0x0;
        local_138[0].content.size_ = 0;
        (*(code *)**(undefined8 **)local_138[0].content.disposer)
                  (local_138[0].content.disposer,pcVar21,1,sVar18,sVar18,0);
      }
    }
  }
  if (((uVar15 == 2) && (pcVar21 = strchr(pcVar19,0x3d), pcVar21 != (char *)0x0)) &&
     (pcVar21[1] != '=')) {
    do {
      pcVar19 = pcVar21 + 1;
      pcVar21 = pcVar21 + 1;
      iVar4 = isspace((int)*pcVar19);
      pcVar19 = pcVar21;
    } while (iVar4 != 0);
  }
  uVar20 = 0;
  if (pcVar19 != (char *)0x0) {
    uVar20 = uVar15;
  }
  if (uVar15 != 1) {
    uVar20 = uVar15;
  }
  local_1e0 = 1;
  local_1d8 = "";
  local_210 = "";
  local_208 = 1;
  if (uVar20 != 0) {
    sVar7 = strlen(pcVar19);
    local_208 = sVar7 + 1;
    local_210 = pcVar19;
  }
  sVar18 = 0;
  memset(local_138,0,0x100);
  if (uVar20 == 1) {
    sVar18 = local_208 + 8;
  }
  else if (uVar20 == 2) {
    local_1d8 = strerror_r((int)code,(char *)local_138,0x100);
    sVar7 = strlen(local_1d8);
    sVar18 = sVar7 + local_208 + 1;
    local_1e0 = sVar7 + 1;
  }
  local_1c8 = __return_storage_ptr__;
  if (argValues.ptr != (String *)0x0) {
    plVar12 = (long *)(macroArgs + 8);
    pSVar10 = (String *)0x0;
    pcVar19 = pcVar5;
    do {
      uVar16 = *(ulong *)(pcVar19 + 8);
      if ((uVar16 == 0xc) && (iVar4 = bcmp(*(void **)pcVar19,"_kjCondition",0xc), iVar4 == 0)) {
        lVar17 = *plVar12;
        if ((lVar17 != 6) || (iVar4 = bcmp((void *)plVar12[-1],"false",6), iVar4 != 0)) {
          lVar9 = 0;
          if (lVar17 != 0) {
            lVar9 = lVar17 + -1;
          }
          sVar18 = sVar18 + lVar9 + 3;
        }
      }
      else {
        sVar8 = sVar18;
        if (pSVar10 != (String *)0x0) {
          sVar8 = sVar18 + 2;
        }
        if (uVar20 != 0) {
          sVar8 = sVar18 + 2;
        }
        if (((uVar16 != 0) && ((char)**(long **)pcVar19 != '\"')) &&
           ((uVar16 < 8 || (**(long **)pcVar19 != 0x287274733a3a6a6b)))) {
          sVar8 = sVar8 + uVar16 + 3;
        }
        lVar17 = 0;
        if (*plVar12 != 0) {
          lVar17 = *plVar12 + -1;
        }
        sVar18 = lVar17 + sVar8;
      }
      pSVar10 = (String *)((long)&(pSVar10->content).ptr + 1);
      pcVar19 = pcVar19 + 0x10;
      plVar12 = plVar12 + 3;
    } while (argValues.ptr != pSVar10);
  }
  pSVar10 = local_1c8;
  heapString(local_1c8,sVar18);
  pcVar19 = (char *)(pSVar10->content).size_;
  if (pcVar19 != (char *)0x0) {
    pcVar19 = (pSVar10->content).ptr;
  }
  if (uVar20 == 1) {
    builtin_strncpy(pcVar19,"expected ",9);
    pcVar19 = pcVar19 + 9;
    local_1d8 = local_210;
    local_1e0 = local_208;
  }
  else {
    if (uVar20 != 2) goto LAB_001a5741;
    if (local_210 != local_210 + local_208 + -1) {
      memcpy(pcVar19,local_210,local_208 - 1);
      pcVar19 = pcVar19 + local_208 + -1;
    }
    pcVar19[0] = ':';
    pcVar19[1] = ' ';
    pcVar19 = pcVar19 + 2;
  }
  if (local_1d8 != local_1d8 + local_1e0 + -1) {
    memcpy(pcVar19,local_1d8,local_1e0 - 1);
    pcVar19 = pcVar19 + local_1e0 + -1;
  }
LAB_001a5741:
  if (argValues.ptr != (String *)0x0) {
    lVar17 = 8;
    pSVar11 = (String *)0x0;
    do {
      if ((*(long *)(pcVar5 + 8) == 0xc) &&
         (iVar4 = bcmp(*(void **)pcVar5,"_kjCondition",0xc), iVar4 == 0)) {
        if ((*(long *)(macroArgs + lVar17) != 6) ||
           (iVar4 = bcmp(*(void **)(macroArgs + lVar17 + -8),"false",6), iVar4 != 0)) {
          pcVar19[0] = ' ';
          pcVar19[1] = '[';
          pcVar19 = pcVar19 + 2;
          pvVar2 = *(void **)(macroArgs + lVar17 + -8);
          pvVar13 = (void *)((long)pvVar2 + *(long *)(macroArgs + lVar17) + -1);
          if (*(long *)(macroArgs + lVar17) == 0) {
            pvVar13 = (void *)0x0;
            pvVar2 = (void *)0x0;
          }
          if (pvVar2 != pvVar13) {
            memcpy(pcVar19,pvVar2,(long)pvVar13 - (long)pvVar2);
            pcVar19 = pcVar19 + ((long)pvVar13 - (long)pvVar2);
          }
          *pcVar19 = ']';
          pcVar19 = pcVar19 + 1;
        }
      }
      else {
        if (uVar20 != 0 || pSVar11 != (String *)0x0) {
          pcVar19[0] = ';';
          pcVar19[1] = ' ';
          pcVar19 = pcVar19 + 2;
        }
        uVar16 = *(ulong *)(pcVar5 + 8);
        if (((uVar16 != 0) && ((char)**(long **)pcVar5 != '\"')) &&
           ((uVar16 < 8 || (**(long **)pcVar5 != 0x287274733a3a6a6b)))) {
          if (uVar16 != 0) {
            memcpy(pcVar19,*(void **)pcVar5,uVar16);
            pcVar19 = pcVar19 + uVar16;
          }
          pcVar19[2] = ' ';
          pcVar19[0] = ' ';
          pcVar19[1] = '=';
          pcVar19 = pcVar19 + 3;
        }
        pvVar2 = *(void **)(macroArgs + lVar17 + -8);
        pvVar13 = (void *)((long)pvVar2 + *(long *)(macroArgs + lVar17) + -1);
        if (*(long *)(macroArgs + lVar17) == 0) {
          pvVar13 = (void *)0x0;
          pvVar2 = (void *)0x0;
        }
        if (pvVar2 != pvVar13) {
          memcpy(pcVar19,pvVar2,(long)pvVar13 - (long)pvVar2);
          pcVar19 = pcVar19 + ((long)pvVar13 - (long)pvVar2);
        }
      }
      pSVar11 = (String *)((long)&(pSVar11->content).ptr + 1);
      pcVar5 = pcVar5 + 0x10;
      lVar17 = lVar17 + 0x18;
    } while (pSVar11 < argValues.ptr);
  }
  if (local_1f8 != (char *)0x0) {
    (**(code **)*local_1e8)(local_1e8,local_1f8,0x10,pSStack_1f0,pSStack_1f0,0);
  }
  return pSVar10;
}

Assistant:

static String makeDescriptionImpl(DescriptionStyle style, const char* code, int errorNumber,
                                  const char* sysErrorString, const char* macroArgs,
                                  ArrayPtr<String> argValues) {
  KJ_STACK_ARRAY(ArrayPtr<const char>, argNames, argValues.size(), 8, 64);

  if (argValues.size() > 0) {
    size_t index = 0;
    const char* start = macroArgs;
    while (isspace(*start)) ++start;
    const char* pos = start;
    uint depth = 0;
    bool quoted = false;
    while (char c = *pos++) {
      if (quoted) {
        if (c == '\\' && *pos != '\0') {
          ++pos;
        } else if (c == '\"') {
          quoted = false;
        }
      } else {
        if (c == '(') {
          ++depth;
        } else if (c == ')') {
          --depth;
        } else if (c == '\"') {
          quoted = true;
        } else if (c == ',' && depth == 0) {
          if (index < argValues.size()) {
            argNames[index++] = arrayPtr(start, pos - 1);
          }
          while (isspace(*pos)) ++pos;
          start = pos;
          if (*pos == '\0') {
            // ignore trailing comma
            break;
          }
        }
      }
    }
    if (index < argValues.size()) {
      argNames[index++] = arrayPtr(start, pos - 1);
    }

    if (index != argValues.size()) {
      getExceptionCallback().logMessage(LogSeverity::ERROR, __FILE__, __LINE__, 0,
          str("Failed to parse logging macro args into ",
              argValues.size(), " names: ", macroArgs, '\n'));
    }
  }

  if (style == SYSCALL) {
    // Strip off leading "foo = " from code, since callers will sometimes write things like:
    //   ssize_t n;
    //   RECOVERABLE_SYSCALL(n = read(fd, buffer, sizeof(buffer))) { return ""; }
    //   return std::string(buffer, n);
    const char* equalsPos = strchr(code, '=');
    if (equalsPos != nullptr && equalsPos[1] != '=') {
      code = equalsPos + 1;
      while (isspace(*code)) ++code;
    }
  }

  if (style == ASSERTION && code == nullptr) {
    style = LOG;
  }

  {
    StringPtr expected = "expected ";
    StringPtr codeArray = style == LOG ? nullptr : StringPtr(code);
    StringPtr sep = " = ";
    StringPtr delim = "; ";
    StringPtr colon = ": ";
    StringPtr openBracket = " [";
    StringPtr closeBracket = "]";

    StringPtr sysErrorArray;
// On android before marshmallow only the posix version of stderror_r was
// available, even with __USE_GNU.
#if __USE_GNU && !(defined(__ANDROID_API__) && __ANDROID_API__ < 23)
    char buffer[256]{};
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        sysErrorArray = strerror_r(errorNumber, buffer, sizeof(buffer));
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#else
    char buffer[256];
    if (style == SYSCALL) {
      if (sysErrorString == nullptr) {
        strerror_r(errorNumber, buffer, sizeof(buffer));
        sysErrorArray = buffer;
      } else {
        sysErrorArray = sysErrorString;
      }
    }
#endif

    size_t totalSize = 0;
    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        totalSize += expected.size() + codeArray.size();
        break;
      case SYSCALL:
        totalSize += codeArray.size() + colon.size() + sysErrorArray.size();
        break;
    }

    auto needsLabel = [](const ArrayPtr<const char> &argName) -> bool {
      return argName.size() > 0 && argName[0] != '\"' && !argName.startsWith("kj::str("_kjc);
    };

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          totalSize += openBracket.size() + argValues[i].size() + closeBracket.size();
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        totalSize += delim.size();
      }
      if (needsLabel(argNames[i])) {
        totalSize += argNames[i].size() + sep.size();
      }
      totalSize += argValues[i].size();
    }

    String result = heapString(totalSize);
    char* pos = result.begin();

    switch (style) {
      case LOG:
        break;
      case ASSERTION:
        pos = _::fill(pos, expected, codeArray);
        break;
      case SYSCALL:
        pos = _::fill(pos, codeArray, colon, sysErrorArray);
        break;
    }

    for (size_t i = 0; i < argValues.size(); i++) {
      if (argNames[i] == "_kjCondition"_kj) {
        // Special handling: don't output delimiter, we want to append this to the previous item,
        // in brackets. Also, if it's just "[false]" (meaning we didn't manage to extract a
        // comparison), don't add it at all.
        if (argValues[i] != "false") {
          pos = _::fill(pos, openBracket, argValues[i], closeBracket);
        }
        continue;
      }

      if (i > 0 || style != LOG) {
        pos = _::fill(pos, delim);
      }
      if (needsLabel(argNames[i])) {
        pos = _::fill(pos, argNames[i], sep);
      }
      pos = _::fill(pos, argValues[i]);
    }

    return result;
  }
}